

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printPKHASRShiftImm(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  MCOperand *op;
  int64_t iVar2;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  uint Imm;
  uint local_1c;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  iVar2 = MCOperand_getImm(op);
  local_1c = (uint)iVar2;
  if (local_1c == 0) {
    local_1c = 0x20;
  }
  if (local_1c < 10) {
    SStream_concat(in_RDX,", asr #%u",(ulong)local_1c);
  }
  else {
    SStream_concat(in_RDX,", asr #0x%x",(ulong)local_1c);
  }
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    puVar1 = in_RDI->flat_insn->detail->groups +
             (long)(int)((in_RDI->flat_insn->detail->field_6).arm.op_count - 1) * 0x30 + 0x39;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(uint *)(in_RDI->flat_insn->detail->groups +
             (long)(int)((in_RDI->flat_insn->detail->field_6).arm.op_count - 1) * 0x30 + 0x3d) =
         local_1c;
  }
  return;
}

Assistant:

static void printPKHASRShiftImm(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned Imm = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	// A shift amount of 32 is encoded as 0.
	if (Imm == 0)
		Imm = 32;
	//assert(Imm > 0 && Imm <= 32 && "Invalid PKH shift immediate value!");
	if (Imm > HEX_THRESHOLD)
		SStream_concat(O, ", asr #0x%x", Imm);
	else
		SStream_concat(O, ", asr #%u", Imm);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.type = ARM_SFT_ASR;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = Imm;
	}
}